

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_fd.c
# Opt level: O2

int file_open(archive *a,void *client_data)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  stat st;
  
  iVar1 = fstat(*client_data,(stat *)&st);
  if (iVar1 == 0) {
    uVar4 = st.st_mode & 0xf000;
    if (uVar4 == 0x8000) {
      archive_write_set_skip_file(a,st.st_dev,st.st_ino);
    }
    iVar2 = archive_write_get_bytes_in_last_block(a);
    iVar1 = 0;
    if (iVar2 < 0) {
      if ((((uVar4 == 0x1000) || (uVar4 == 0x2000)) || (uVar4 == 0x6000)) || (*client_data == 1)) {
        iVar2 = 0;
      }
      else {
        iVar2 = 1;
      }
      iVar1 = 0;
      archive_write_set_bytes_in_last_block(a,iVar2);
    }
  }
  else {
    piVar3 = __errno_location();
    archive_set_error(a,*piVar3,"Couldn\'t stat fd %d",(ulong)*client_data);
    iVar1 = -0x1e;
  }
  return iVar1;
}

Assistant:

static int
file_open(struct archive *a, void *client_data)
{
	struct write_fd_data *mine;
	struct stat st;

	mine = (struct write_fd_data *)client_data;

	if (fstat(mine->fd, &st) != 0) {
		archive_set_error(a, errno, "Couldn't stat fd %d", mine->fd);
		return (ARCHIVE_FATAL);
	}

	/*
	 * If this is a regular file, don't add it to itself.
	 */
	if (S_ISREG(st.st_mode))
		archive_write_set_skip_file(a, st.st_dev, st.st_ino);

	/*
	 * If client hasn't explicitly set the last block handling,
	 * then set it here.
	 */
	if (archive_write_get_bytes_in_last_block(a) < 0) {
		/* If the output is a block or character device, fifo,
		 * or stdout, pad the last block, otherwise leave it
		 * unpadded. */
		if (S_ISCHR(st.st_mode) || S_ISBLK(st.st_mode) ||
		    S_ISFIFO(st.st_mode) || (mine->fd == 1))
			/* Last block will be fully padded. */
			archive_write_set_bytes_in_last_block(a, 0);
		else
			archive_write_set_bytes_in_last_block(a, 1);
	}

	return (ARCHIVE_OK);
}